

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O3

void __thiscall libwebm::TempFileDeleter::TempFileDeleter(TempFileDeleter *this)

{
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  (this->file_name_)._M_dataplus._M_p = (pointer)&(this->file_name_).field_2;
  (this->file_name_)._M_string_length = 0;
  (this->file_name_).field_2._M_local_buf[0] = '\0';
  GetTempFileName_abi_cxx11_();
  std::__cxx11::string::operator=((string *)this,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

TempFileDeleter::TempFileDeleter() { file_name_ = GetTempFileName(); }